

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecheckPass.cpp
# Opt level: O0

PreservedAnalyses * __thiscall
Precheck::run(PreservedAnalyses *__return_storage_ptr__,Precheck *this,Function *F,
             FunctionAnalysisManager *FM)

{
  UnnamedAddr UVar1;
  ulong uVar2;
  StringRef SVar3;
  Twine local_148;
  StringRef local_120;
  Twine local_110;
  Twine local_e8;
  Twine local_c0;
  StringRef local_98;
  Twine local_88;
  Twine local_60;
  StringRef local_38;
  FunctionAnalysisManager *local_28;
  FunctionAnalysisManager *FM_local;
  Function *F_local;
  Precheck *this_local;
  
  local_28 = FM;
  FM_local = (FunctionAnalysisManager *)F;
  F_local = (Function *)this;
  this_local = (Precheck *)__return_storage_ptr__;
  llvm::StringRef::StringRef(&local_38,"shellvm-main");
  SVar3.Length = (size_t)local_38.Data;
  SVar3.Data = (char *)F;
  uVar2 = llvm::Function::hasFnAttribute(SVar3);
  if ((uVar2 & 1) == 0) {
    UVar1 = llvm::GlobalValue::getUnnamedAddr((GlobalValue *)FM_local);
    if (UVar1 != None) {
      local_98 = (StringRef)llvm::Value::getName();
      llvm::operator+(&local_88,"Function ",&local_98);
      llvm::Twine::Twine(&local_c0," is not marked as unnamed_addr!");
      llvm::operator+(&local_60,&local_88,&local_c0);
      llvm::report_fatal_error(&local_60,true);
    }
  }
  else {
    UVar1 = llvm::GlobalValue::getUnnamedAddr((GlobalValue *)FM_local);
    if (UVar1 != Local) {
      local_120 = (StringRef)llvm::Value::getName();
      llvm::operator+(&local_110,"SheLLVM main function ",&local_120);
      llvm::Twine::Twine(&local_148," is not marked as local_unnamed_addr!");
      llvm::operator+(&local_e8,&local_110,&local_148);
      llvm::report_fatal_error(&local_e8,true);
    }
  }
  llvm::PreservedAnalyses::all();
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses Precheck::run(Function &F,
                                      FunctionAnalysisManager &FM) {
  if (!F.hasFnAttribute("shellvm-main")) {
    if (F.getUnnamedAddr() != GlobalValue::UnnamedAddr::None) {
      report_fatal_error("Function " + F.getName() +
                         " is not marked as unnamed_addr!");
    }
  } else {
    if (F.getUnnamedAddr() != GlobalValue::UnnamedAddr::Local) {
      report_fatal_error("SheLLVM main function " + F.getName() +
                         " is not marked as local_unnamed_addr!");
    }
  }

  return PreservedAnalyses::all();
}